

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O2

ps_alignment_iter_t * ps_alignment_phones(ps_alignment_t *al)

{
  ps_alignment_iter_t *ppVar1;
  
  if ((al->sseq).n_ent != 0) {
    ppVar1 = (ps_alignment_iter_t *)
             __ckd_calloc__(1,0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                            ,0x176);
    ppVar1->al = al;
    ppVar1->vec = &al->sseq;
    ppVar1->pos = 0;
    ppVar1->parent = -1;
    return ppVar1;
  }
  return (ps_alignment_iter_t *)0x0;
}

Assistant:

ps_alignment_iter_t *
ps_alignment_phones(ps_alignment_t *al)
{
    ps_alignment_iter_t *itor;

    if (al->sseq.n_ent == 0)
        return NULL;
    itor = ckd_calloc(1, sizeof(*itor));
    itor->al = al;
    itor->vec = &al->sseq;
    itor->pos = 0;
    /* Iterate over *all* phones */
    itor->parent = PS_ALIGNMENT_NONE;
    return itor;
}